

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprpc.cpp
# Opt level: O2

shared_ptr<mprpc::MpRpcMessage> __thiscall
mprpc::MpRpcClient::call(MpRpcClient *this,char *method,char *params,size_t params_size,int timeout)

{
  int *piVar1;
  int iVar2;
  _Invoker_type p_Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  undefined4 in_register_00000084;
  int in_R9D;
  shared_ptr<mprpc::MpRpcMessage> sVar5;
  undefined1 local_130 [8];
  function<void_(std::shared_ptr<mprpc::MpRpcMessage>)> local_128;
  undefined1 local_108 [16];
  _Function_base local_f8;
  code *pcStack_e0;
  _Any_data local_d8;
  atomic<unsigned_long> local_c8;
  ImplicitProducer *pIStack_c0;
  unique_lock<std::mutex> lock;
  FutureLoop<mprpc::MpRpcMessage,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a0;
  undefined1 local_90 [8];
  condition_variable cond;
  mutex mtx;
  
  local_128.super__Function_base._M_manager = (_Manager_type)CONCAT44(in_register_00000084,timeout);
  LOCK();
  piVar1 = (int *)(method + 0x548);
  iVar2 = *piVar1;
  *piVar1 = *piVar1 + 1;
  UNLOCK();
  if (in_R9D == 0) {
    asnyc_call_abi_cxx11_((MpRpcClient *)local_90,method,params,params_size,timeout);
    LOCK();
    *(int *)local_90 = *(int *)local_90 + -1;
    UNLOCK();
    (this->super_Connection_Callback)._vptr_Connection_Callback = (_func_int **)0x0;
    (this->super_MsgLoopRun)._vptr_MsgLoopRun = (_func_int **)0x0;
    _Var4._M_pi = extraout_RDX_00;
  }
  else {
    mtx.super___mutex_base._M_mutex._16_8_ = 0;
    mtx.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
    mtx.super___mutex_base._M_mutex.__align = 0;
    mtx.super___mutex_base._M_mutex._8_8_ = 0;
    mtx.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
    local_128._M_invoker = (_Invoker_type)params;
    std::condition_variable::condition_variable(&cond);
    (this->super_Connection_Callback)._vptr_Connection_Callback = (_func_int **)0x0;
    (this->super_MsgLoopRun)._vptr_MsgLoopRun = (_func_int **)0x0;
    std::unique_lock<std::mutex>::unique_lock(&lock,&mtx);
    p_Var3 = local_128._M_invoker;
    asnyc_call_abi_cxx11_
              ((MpRpcClient *)local_130,method,(char *)local_128._M_invoker,params_size,
               (__int_type_conflict2)(__int_type_conflict2)local_128.super__Function_base._M_manager
              );
    local_128.super__Function_base._M_functor._M_unused._M_object = (_func_int **)0x0;
    local_128.super__Function_base._M_functor._8_8_ = local_130;
    LOCK();
    *(int *)(_func_int ***)local_130 = *(int *)(_func_int ***)local_130 + 1;
    UNLOCK();
    local_c8.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
    pIStack_c0 = (ImplicitProducer *)0x0;
    local_d8._M_unused._M_object = (ImplicitProducerKVP *)0x0;
    local_d8._8_8_ = (ImplicitProducerHash *)0x0;
    local_d8._M_unused._M_object = operator_new(0x18);
    (((ImplicitProducerKVP *)local_d8._M_unused._0_8_)->key).super___atomic_base<unsigned_long>._M_i
         = (__int_type_conflict)&mtx;
    ((ImplicitProducerKVP *)local_d8._M_unused._0_8_)->value = (ImplicitProducer *)&cond;
    (((ImplicitProducerKVP *)((long)local_d8._M_unused._0_8_ + 0x10))->key).
    super___atomic_base<unsigned_long>._M_i = (__int_type_conflict)this;
    pIStack_c0 = (ImplicitProducer *)
                 std::
                 _Function_handler<void_(std::shared_ptr<mprpc::MpRpcMessage>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/xutiezhu[P]tqapi/lib/myutils/mprpc.cpp:267:29)>
                 ::_M_invoke;
    local_c8.super___atomic_base<unsigned_long>._M_i =
         (__atomic_base<unsigned_long>)
         std::
         _Function_handler<void_(std::shared_ptr<mprpc::MpRpcMessage>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/xutiezhu[P]tqapi/lib/myutils/mprpc.cpp:267:29)>
         ::_M_manager;
    loop::
    FutureLoop<mprpc::MpRpcMessage,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::on_success((FutureLoop<mprpc::MpRpcMessage,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_108,&local_128);
    local_f8._M_manager = (_Manager_type)0x0;
    pcStack_e0 = (code *)0x0;
    local_f8._M_functor._M_unused._M_object = (__pointer_type)0x0;
    local_f8._M_functor._8_8_ = (__pointer_type)0x0;
    local_f8._M_functor._M_unused._M_object = operator_new(0x28);
    *(int *)&((__pointer_type)local_f8._M_functor._M_unused._0_8_)->field_0 = iVar2 + 1;
    *(_Invoker_type *)((long)&((__pointer_type)local_f8._M_functor._M_unused._0_8_)->field_0 + 8) =
         p_Var3;
    *(mutex_type **)((long)&((__pointer_type)local_f8._M_functor._M_unused._0_8_)->field_0 + 0x10) =
         &mtx;
    *(ImplicitProducer **)
     ((long)&((__pointer_type)local_f8._M_functor._M_unused._0_8_)->field_0 + 0x18) =
         (ImplicitProducer *)&cond;
    *(MpRpcClient **)((long)&((__pointer_type)local_f8._M_functor._M_unused._0_8_)->field_0 + 0x20)
         = this;
    pcStack_e0 = std::
                 _Function_handler<void_(std::shared_ptr<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/xutiezhu[P]tqapi/lib/myutils/mprpc.cpp:272:29)>
                 ::_M_invoke;
    local_f8._M_manager =
         std::
         _Function_handler<void_(std::shared_ptr<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/xutiezhu[P]tqapi/lib/myutils/mprpc.cpp:272:29)>
         ::_M_manager;
    loop::
    FutureLoop<mprpc::MpRpcMessage,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::on_failure(&local_a0,
                 (function<void_(std::shared_ptr<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
                  *)local_108);
    LOCK();
    *(int *)local_a0.m_prom = *(int *)local_a0.m_prom + -1;
    UNLOCK();
    std::_Function_base::~_Function_base(&local_f8);
    LOCK();
    *(int *)local_108._8_8_ = *(int *)local_108._8_8_ + -1;
    UNLOCK();
    std::_Function_base::~_Function_base((_Function_base *)&local_d8);
    LOCK();
    *(int *)local_128.super__Function_base._M_functor._8_8_ =
         *(int *)local_128.super__Function_base._M_functor._8_8_ + -1;
    UNLOCK();
    LOCK();
    *(int *)local_130 = *(int *)local_130 + -1;
    UNLOCK();
    std::condition_variable::wait((unique_lock *)&cond);
    std::unique_lock<std::mutex>::~unique_lock(&lock);
    std::condition_variable::~condition_variable(&cond);
    _Var4._M_pi = extraout_RDX;
  }
  sVar5.super___shared_ptr<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  sVar5.super___shared_ptr<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mprpc::MpRpcMessage>)
         sVar5.super___shared_ptr<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<MpRpcMessage> MpRpcClient::call(const char* method, const char* params, size_t params_size, int timeout)
    {
        int callid = ++m_cur_callid;

        if (!timeout) {
            asnyc_call(method, params, params_size, timeout);
            return nullptr;
        } else {
            mutex mtx;
            condition_variable  cond;
            shared_ptr<MpRpcMessage> rsp_msg;

            unique_lock<mutex> lock(mtx);

            asnyc_call(method, params, params_size, timeout)
                .in_loop(nullptr)
                .on_success([&mtx, &cond, &rsp_msg](shared_ptr<MpRpcMessage> msg) {
                    unique_lock<mutex> lock(mtx);
                    rsp_msg = msg;
                    cond.notify_one();
                })
                .on_failure([callid, method, &mtx, &cond, &rsp_msg](shared_ptr<pair<int, string>> e) {
                    auto rsp = make_shared<MpRpcMessage>();
                    rsp->err_code = e->first;
                    rsp->err_msg = e->second;
                    rsp->id = callid;
                    rsp->method = method;
                    unique_lock<mutex> lock(mtx);
                    rsp_msg = rsp;
                    cond.notify_one();
                });
        

            cond.wait(lock);
            return rsp_msg;
        }
    }